

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<double>::Fad<FadFuncSinh<Fad<double>>>
          (Fad<double> *this,FadExpr<FadFuncSinh<Fad<double>_>_> *fadexpr)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  value_type vVar4;
  
  vVar4 = FadFuncSinh<Fad<double>_>::val(&fadexpr->fadexpr_);
  this->val_ = vVar4;
  Vector<double>::Vector(&this->dx_,(fadexpr->fadexpr_).expr_.dx_.num_elts);
  this->defaultVal = 0.0;
  uVar1 = (fadexpr->fadexpr_).expr_.dx_.num_elts;
  if (uVar1 != 0) {
    uVar2 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      vVar4 = FadFuncSinh<Fad<double>_>::dx(&fadexpr->fadexpr_,(int)uVar2);
      (this->dx_).ptr_to_data[uVar2] = vVar4;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }